

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateVariableAccess
          (ExpressionContext *ctx,SynBase *source,IntrusiveList<SynIdentifier> path,InplaceStr name,
          bool allowInternal)

{
  ScopeData **ppSVar1;
  TypeBase *pTVar2;
  FunctionLookupChain chain;
  ScopeData **ppSVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  IdentifierLookupResult *pIVar7;
  ExprBase *pEVar8;
  ScopeData *pSVar9;
  undefined4 extraout_var;
  SynIdentifier *pSVar11;
  VariableData *variable;
  ScopeData *pSVar12;
  Node *pNVar13;
  ScopeData *pSVar14;
  char *str;
  char *end;
  long *plVar15;
  InplaceStr local_58;
  NodeIterator local_48;
  ScopeData *local_38;
  SynIdentifier *pSVar10;
  
  end = name.end;
  str = name.begin;
  pSVar11 = path.head;
  local_58.begin = str;
  local_58.end = end;
  uVar5 = NULLC::GetStringHash("");
  pSVar10 = pSVar11;
  if (pSVar11 != (SynIdentifier *)0x0) {
    do {
      uVar5 = NULLC::StringHashContinue(uVar5,(pSVar10->name).begin,(pSVar10->name).end);
      uVar5 = NULLC::StringHashContinue(uVar5,".");
      pSVar10 = (SynIdentifier *)(pSVar10->super_SynBase).next;
      if (pSVar10 == (SynIdentifier *)0x0) break;
    } while ((pSVar10->super_SynBase).typeID == 4);
  }
  uVar5 = NULLC::StringHashContinue(uVar5,str,end);
  pIVar7 = anon_unknown.dwarf_c3752::LookupObjectByName(ctx,uVar5);
  if ((pIVar7 != (IdentifierLookupResult *)0x0) &&
     (variable = pIVar7->variable, variable != (VariableData *)0x0)) {
    pSVar9 = variable->scope;
    do {
      pSVar12 = pSVar9;
      if ((pSVar12 == (ScopeData *)0x0) || (pSVar12->ownerNamespace != (NamespaceData *)0x0)) break;
      pSVar9 = pSVar12->scope;
    } while (pSVar12->scope != (ScopeData *)0x0);
    if (pSVar12 != ctx->globalScope) {
LAB_0016ae1d:
      pEVar8 = CreateVariableAccess(ctx,source,variable,true);
      return pEVar8;
    }
  }
  ppSVar1 = &ctx->scope;
  pSVar9 = ctx->scope;
  pSVar12 = pSVar9;
  do {
    pSVar14 = pSVar12;
    if (pSVar14 == (ScopeData *)0x0) goto LAB_0016af2b;
  } while ((pSVar14->ownerNamespace == (NamespaceData *)0x0) &&
          (pSVar12 = pSVar14->scope, pSVar14->scope != (ScopeData *)0x0));
  do {
    if (pSVar14->ownerNamespace == (NamespaceData *)0x0) {
      uVar5 = NULLC::GetStringHash("");
    }
    else {
      uVar5 = NULLC::StringHashContinue(pSVar14->ownerNamespace->fullNameHash,".");
    }
    pSVar10 = pSVar11;
    if (pSVar11 != (SynIdentifier *)0x0) {
      do {
        uVar5 = NULLC::StringHashContinue(uVar5,(pSVar10->name).begin,(pSVar10->name).end);
        uVar5 = NULLC::StringHashContinue(uVar5,".");
        pSVar10 = (SynIdentifier *)(pSVar10->super_SynBase).next;
        if (pSVar10 == (SynIdentifier *)0x0) break;
      } while ((pSVar10->super_SynBase).typeID == 4);
    }
    uVar5 = NULLC::StringHashContinue(uVar5,str,end);
    pIVar7 = anon_unknown.dwarf_c3752::LookupObjectByName(ctx,uVar5);
    if ((pIVar7 != (IdentifierLookupResult *)0x0) &&
       (variable = pIVar7->variable, variable != (VariableData *)0x0)) goto LAB_0016ae1d;
    pSVar9 = pSVar14->scope;
    do {
      pSVar14 = pSVar9;
      if (pSVar14 == (ScopeData *)0x0) {
        pSVar9 = *ppSVar1;
        goto LAB_0016af2b;
      }
    } while ((pSVar14->ownerNamespace == (NamespaceData *)0x0) &&
            (pSVar9 = pSVar14->scope, pSVar14->scope != (ScopeData *)0x0));
  } while( true );
LAB_0016af2b:
  pSVar12 = pSVar9;
  if (pSVar9 != (ScopeData *)0x0) {
    do {
      pTVar2 = pSVar12->ownerType;
      if (pTVar2 != (TypeBase *)0x0) {
        if (((pTVar2->typeID < 0x1a) && ((0x3130000U >> (pTVar2->typeID & 0x1f) & 1) != 0)) &&
           (plVar15 = (long *)pTVar2[1].name.end, plVar15 != (long *)0x0)) {
          do {
            bVar4 = InplaceStr::operator==((InplaceStr *)(*plVar15 + 0x40),&local_58);
            if (bVar4) {
              pEVar8 = CreateLiteralCopy(ctx,source,(ExprBase *)plVar15[1]);
              return pEVar8;
            }
            plVar15 = (long *)plVar15[2];
          } while (plVar15 != (long *)0x0);
          pSVar9 = *ppSVar1;
        }
        break;
      }
      ppSVar3 = &pSVar12->scope;
      pSVar12 = *ppSVar3;
    } while (*ppSVar3 != (ScopeData *)0x0);
    if (pSVar9 != (ScopeData *)0x0 && pSVar11 == (SynIdentifier *)0x0) {
      do {
        if (pSVar9->ownerType != (TypeBase *)0x0) {
          uVar5 = NULLC::GetStringHash("this","");
          pIVar7 = anon_unknown.dwarf_c3752::LookupObjectByName(ctx,uVar5);
          if ((pIVar7 != (IdentifierLookupResult *)0x0) && (pIVar7->variable != (VariableData *)0x0)
             ) {
            pEVar8 = CreateVariableAccess(ctx,source,pIVar7->variable,true);
            iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pSVar10 = (SynIdentifier *)CONCAT44(extraout_var,iVar6);
            (pSVar10->super_SynBase).typeID = 4;
            (pSVar10->super_SynBase).begin = (Lexeme *)0x0;
            (pSVar10->super_SynBase).end = (Lexeme *)0x0;
            (pSVar10->super_SynBase).pos.begin = (char *)0x0;
            (pSVar10->super_SynBase).pos.end = (char *)0x0;
            *(undefined8 *)((long)&(pSVar10->super_SynBase).pos.end + 2) = 0;
            *(undefined8 *)((long)&(pSVar10->super_SynBase).next + 2) = 0;
            (pSVar10->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
            (pSVar10->name).begin = local_58.begin;
            (pSVar10->name).end = local_58.end;
            pEVar8 = CreateMemberAccess(ctx,source,pEVar8,pSVar10,true);
            if (pEVar8 != (ExprBase *)0x0) {
              return pEVar8;
            }
          }
          break;
        }
        pSVar9 = pSVar9->scope;
      } while (pSVar9 != (ScopeData *)0x0);
    }
  }
  pSVar9 = *ppSVar1;
  do {
    pSVar12 = pSVar9;
    if (pSVar12 == (ScopeData *)0x0) {
      return (ExprBase *)0x0;
    }
  } while ((pSVar12->ownerNamespace == (NamespaceData *)0x0) &&
          (pSVar9 = pSVar12->scope, pSVar12->scope != (ScopeData *)0x0));
  do {
    if (pSVar12->ownerNamespace == (NamespaceData *)0x0) {
      uVar5 = NULLC::GetStringHash("");
    }
    else {
      uVar5 = NULLC::StringHashContinue(pSVar12->ownerNamespace->fullNameHash,".");
    }
    pSVar10 = pSVar11;
    if (pSVar11 != (SynIdentifier *)0x0) {
      do {
        uVar5 = NULLC::StringHashContinue(uVar5,(pSVar10->name).begin,(pSVar10->name).end);
        uVar5 = NULLC::StringHashContinue(uVar5,".");
        pSVar10 = (SynIdentifier *)(pSVar10->super_SynBase).next;
        if (pSVar10 == (SynIdentifier *)0x0) break;
      } while ((pSVar10->super_SynBase).typeID == 4);
    }
    uVar5 = NULLC::StringHashContinue(uVar5,local_58.begin,local_58.end);
    local_38 = (ScopeData *)ppSVar1;
    do {
      local_38 = local_38->scope;
      if (local_38 == (ScopeData *)0x0) goto LAB_0016b120;
      local_48 = DirectChainedMap<IdentifierLookupResult>::first(&local_38->idLookupMap,uVar5);
      pNVar13 = local_48.node;
    } while (pNVar13 == (Node *)0x0);
    if (*(long *)(pNVar13 + 0x10) != 0) {
      if (*(char *)(*(long *)(pNVar13 + 0x10) + 0x10) == '\x01' && !allowInternal) {
        pEVar8 = (ExprBase *)0x0;
      }
      else {
        chain.scope = local_38;
        chain.node.start = local_48.start;
        chain.node.node = local_48.node;
        pEVar8 = CreateFunctionAccess(ctx,source,chain,(ExprBase *)0x0);
      }
      return pEVar8;
    }
LAB_0016b120:
    pSVar9 = pSVar12->scope;
    do {
      pSVar12 = pSVar9;
      if (pSVar12 == (ScopeData *)0x0) {
        return (ExprBase *)0x0;
      }
    } while ((pSVar12->ownerNamespace == (NamespaceData *)0x0) &&
            (pSVar9 = pSVar12->scope, pSVar12->scope != (ScopeData *)0x0));
  } while( true );
}

Assistant:

ExprBase* CreateVariableAccess(ExpressionContext &ctx, SynBase *source, IntrusiveList<SynIdentifier> path, InplaceStr name, bool allowInternal)
{
	// Check local scope first
	{
		unsigned hash = NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(VariableData *variable = LookupVariableByName(ctx, hash))
		{
			// Must be non-global scope
			if(NamedOrGlobalScopeFrom(variable->scope) != ctx.globalScope)
				return CreateVariableAccess(ctx, source, variable, true);
		}
	}

	// Search for variable starting from current namespace to global scope
	for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
	{
		unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(VariableData *variable = LookupVariableByName(ctx, hash))
			return CreateVariableAccess(ctx, source, variable, true);
	}

	{
		// Try a class constant or an alias
		if(TypeStruct *structType = getType<TypeStruct>(ctx.GetCurrentType(ctx.scope)))
		{
			for(ConstantData *curr = structType->constants.head; curr; curr = curr->next)
			{
				if(curr->name->name == name)
					return CreateLiteralCopy(ctx, source, curr->value);
			}
		}
	}

	if(path.empty())
	{
		if(FindNextTypeFromScope(ctx.scope))
		{
			if(VariableData *variable = LookupVariableByName(ctx, InplaceStr("this").hash()))
			{
				if(ExprBase *member = CreateMemberAccess(ctx, source, CreateVariableAccess(ctx, source, variable, true), new (ctx.get<SynIdentifier>()) SynIdentifier(name), true))
					return member;
			}
		}
	}

	FunctionLookupChain function;

	for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
	{
		unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		function = LookupFunctionChainByName(ctx, hash);

		if(function)
		{
			if(function->isInternal && !allowInternal)
				function = FunctionLookupChain();

			break;
		}
	}

	if(function)
		return CreateFunctionAccess(ctx, source, function, NULL);

	return NULL;
}